

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O1

lys_type * lyd_leaf_type(lyd_node_leaf_list *leaf)

{
  int iVar1;
  lys_type *local_28;
  lys_type *type;
  
  if ((leaf == (lyd_node_leaf_list *)0x0) ||
     ((leaf->schema->nodetype & (LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN)) {
LAB_001703b3:
    local_28 = (lys_type *)0x0;
  }
  else {
    local_28 = (lys_type *)&leaf->schema[1].ref;
    do {
      if (local_28->base == LY_TYPE_UNION) {
        if (((local_28->info).uni.has_ptr_type != 0) && (leaf->validity != '\0')) {
          ly_vlog(leaf->schema->module->ctx,LYE_SPEC,LY_VLOG_LYD,leaf,
                  "Unable to determine the type of value \"%s\" from union type \"%s\" prior to validation."
                  ,leaf->value_str,local_28->der->name);
          return (lys_type *)0x0;
        }
        iVar1 = resolve_union(leaf,local_28,0,0,&local_28);
        if (iVar1 != 0) goto LAB_001703b3;
      }
      else if (local_28->base == LY_TYPE_LEAFREF) {
        local_28 = &((local_28->info).lref.target)->type;
      }
    } while (local_28->base == LY_TYPE_LEAFREF);
  }
  return local_28;
}

Assistant:

lys_type *
lyd_leaf_type(const struct lyd_node_leaf_list *leaf)
{
    struct lys_type *type;

    if (!leaf || !(leaf->schema->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
        return NULL;
    }

    type = &((struct lys_node_leaf *)leaf->schema)->type;

    do {
        if (type->base == LY_TYPE_LEAFREF) {
            type = &type->info.lref.target->type;
        } else if (type->base == LY_TYPE_UNION) {
            if (type->info.uni.has_ptr_type && leaf->validity) {
                /* we don't know what it will be after resolution (validation) */
                LOGVAL(leaf->schema->module->ctx, LYE_SPEC, LY_VLOG_LYD, leaf,
                       "Unable to determine the type of value \"%s\" from union type \"%s\" prior to validation.",
                       leaf->value_str, type->der->name);
                return NULL;
            }

            if (resolve_union((struct lyd_node_leaf_list *)leaf, type, 0, 0, &type)) {
                /* resolve union failed */
                return NULL;
            }
        }
    } while (type->base == LY_TYPE_LEAFREF);

    return type;
}